

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  int i_00;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *in_RSI;
  long in_RDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  int under_this_window_idx;
  int start_idx;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  pIVar1 = GImGui;
  i_00 = (GImGui->WindowsFocusOrder).Size + -1;
  if ((in_RDI != 0) &&
     (iVar2 = FindWindowFocusIndex
                        ((ImGuiWindow *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)), iVar2 != -1
     )) {
    i_00 = iVar2 + -1;
  }
  while( true ) {
    if (i_00 < 0) {
      FocusWindow(in_RSI);
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,i_00);
    window_00 = *ppIVar3;
    if ((((window_00 != in_RSI) && ((window_00->WasActive & 1U) != 0)) &&
        ((window_00->Flags & 0x1000000U) == 0)) && ((window_00->Flags & 0x40200U) != 0x40200))
    break;
    i_00 = i_00 + -1;
  }
  NavRestoreLastChildNavWindow(window_00);
  FocusWindow(in_RSI);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}